

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::expected(Parser *this,char *what)

{
  ostream *poVar1;
  ParseException *this_00;
  char *message;
  Token local_220;
  Token local_1e8;
  stringstream local_1a0 [8];
  stringstream msg;
  ostream local_190 [376];
  char *local_18;
  char *what_local;
  Parser *this_local;
  
  local_18 = what;
  what_local = (char *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Expected ");
  poVar1 = std::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1," on line ");
  token(&local_1e8,this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1e8.line);
  poVar1 = std::operator<<(poVar1," column ");
  token(&local_220,this);
  std::ostream::operator<<(poVar1,local_220.col);
  Token::~Token(&local_220);
  Token::~Token(&local_1e8);
  this_00 = (ParseException *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  message = (char *)std::__cxx11::string::c_str();
  ParseException::ParseException(this_00,message);
  __cxa_throw(this_00,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

void Parser::expected(const char* what) {
    std::stringstream msg;
    msg << "Expected " << what << " on line " << token().line << " column " << token().col;
    throw ParseException(msg.str().c_str());
}